

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::CalculatePosition
          (SscReaderGeneric *this,BlockVecVec *bvv,RankPosMap *allRanks)

{
  int iVar1;
  unsigned_long uVar2;
  bool bVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  undefined8 in_RDX;
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  *in_RSI;
  size_t currentRankTotalSize;
  BlockInfo *b;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  value_type *bv;
  pair<const_int,_std::pair<unsigned_long,_unsigned_long>_> *r;
  iterator __end4;
  iterator __begin4;
  RankPosMap *__range4;
  bool hasOverlap;
  int rank;
  size_t bufferPosition;
  unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff68;
  unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff70;
  reference in_stack_ffffffffffffff90;
  __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_60;
  reference local_58;
  reference local_50;
  reference local_48;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_38;
  undefined8 local_30;
  byte local_25;
  int local_24;
  unsigned_long local_20;
  undefined8 local_18;
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  *local_10;
  
  local_20 = 0;
  local_24 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    iVar1 = local_24;
    sVar4 = std::
            vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
            ::size(local_10);
    if ((int)sVar4 <= iVar1) {
      return;
    }
    local_25 = 0;
    local_30 = local_18;
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
         ::begin(in_stack_ffffffffffffff68);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
         ::end(in_stack_ffffffffffffff68);
    while (bVar3 = std::__detail::operator!=(&local_38,&local_40), bVar3) {
      local_48 = std::__detail::
                 _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                              *)0x1e5373);
      if (local_48->first == local_24) {
        local_25 = 1;
        break;
      }
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                  *)in_stack_ffffffffffffff70);
    }
    uVar2 = local_20;
    if ((local_25 & 1) != 0) {
      pmVar5 = std::
               unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator[](in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
      pmVar5->first = uVar2;
      local_58 = std::
                 vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 ::operator[](local_10,(long)local_24);
      local_50 = local_58;
      local_60._M_current =
           (BlockInfo *)
           std::
           vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
           ::begin((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                    *)in_stack_ffffffffffffff68);
      std::
      vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
      ::end((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             *)in_stack_ffffffffffffff68);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                                 *)in_stack_ffffffffffffff70,
                                (__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                                 *)in_stack_ffffffffffffff68), bVar3) {
        in_stack_ffffffffffffff90 =
             __gnu_cxx::
             __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
             ::operator*(&local_60);
        in_stack_ffffffffffffff90->bufferStart = local_20 + in_stack_ffffffffffffff90->bufferStart;
        __gnu_cxx::
        __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
        ::operator++(&local_60);
      }
      sVar6 = TotalDataSize((BlockVec *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff70 =
           (unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            *)(sVar6 + 1);
      pmVar5 = std::
               unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator[](in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
      pmVar5->second = (unsigned_long)in_stack_ffffffffffffff70;
      local_20 = sVar6 + 1 + local_20;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void SscReaderGeneric::CalculatePosition(ssc::BlockVecVec &bvv, ssc::RankPosMap &allRanks)
{

    size_t bufferPosition = 0;

    for (int rank = 0; rank < static_cast<int>(bvv.size()); ++rank)
    {
        bool hasOverlap = false;
        for (const auto &r : allRanks)
        {
            if (r.first == rank)
            {
                hasOverlap = true;
                break;
            }
        }
        if (hasOverlap)
        {
            allRanks[rank].first = bufferPosition;
            auto &bv = bvv[rank];
            for (auto &b : bv)
            {
                b.bufferStart += bufferPosition;
            }
            size_t currentRankTotalSize = ssc::TotalDataSize(bv);
            allRanks[rank].second = currentRankTotalSize + 1;
            bufferPosition += currentRankTotalSize + 1;
        }
    }
}